

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BgzfStream::ReadBlock(BgzfStream *this)

{
  undefined8 *puVar1;
  bool bVar2;
  unsigned_short uVar3;
  undefined8 uVar4;
  string *message_00;
  size_t sVar5;
  int *in_RDI;
  size_t newBlockLength;
  string message_1;
  size_t remaining;
  size_t blockLength;
  string message;
  int64_t numBytesRead;
  char header [18];
  int64_t blockAddress;
  char *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  string *where;
  BamException *in_stack_fffffffffffffd60;
  BamException *this_00;
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [38];
  undefined1 local_20a;
  allocator local_209;
  string local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  allocator local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  ulong local_180;
  long local_178;
  undefined1 local_16a;
  allocator local_169;
  string local_168 [40];
  string local_140 [24];
  size_t *in_stack_fffffffffffffed8;
  undefined6 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee6;
  exception in_stack_fffffffffffffee7;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ulong local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined2 local_18;
  undefined8 local_10;
  
  bamtools_noop();
  local_10 = (**(code **)(**(long **)(in_RDI + 6) + 0x38))();
  local_30 = (**(code **)(**(long **)(in_RDI + 6) + 0x28))(*(long **)(in_RDI + 6),&local_28,0x12);
  if ((long)local_30 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"device error: ",&local_71);
    (**(code **)(**(long **)(in_RDI + 6) + 0x48))(&local_a8);
    std::operator+(&local_50,&local_70,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    local_ca = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"BgzfStream::ReadBlock",&local_c9);
    BamException::BamException
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    local_ca = 0;
    __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
  }
  if (local_30 == 0) {
    *in_RDI = 0;
  }
  else {
    if (local_30 != 0x12) {
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"BgzfStream::ReadBlock",&local_f1);
      this_00 = (BamException *)&stack0xfffffffffffffee7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"invalid block header size",(allocator *)this_00);
      BamException::BamException(this_00,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
    }
    bVar2 = CheckBlockHeader(in_stack_fffffffffffffd20);
    if (!bVar2) {
      local_16a = 1;
      message_00 = (string *)__cxa_allocate_exception(0x28);
      where = (string *)(local_168 + 0x27);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"BgzfStream::ReadBlock",(allocator *)where);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,"invalid block header contents",&local_169);
      BamException::BamException(in_stack_fffffffffffffd60,where,message_00);
      local_16a = 0;
      __cxa_throw(message_00,&BamException::typeinfo,BamException::~BamException);
    }
    uVar3 = UnpackUnsignedShort((char *)0x2c9bec);
    local_178 = (long)(int)(uVar3 + 1);
    puVar1 = *(undefined8 **)(in_RDI + 0xc);
    *puVar1 = local_28;
    puVar1[1] = local_20;
    *(undefined2 *)(puVar1 + 2) = local_18;
    local_180 = local_178 - 0x12;
    local_30 = (**(code **)(**(long **)(in_RDI + 6) + 0x28))
                         (*(long **)(in_RDI + 6),*(long *)(in_RDI + 0xc) + 0x12,
                          local_180 & 0xffffffff);
    if ((long)local_30 < 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c0,"device error: ",&local_1c1);
      (**(code **)(**(long **)(in_RDI + 6) + 0x48))(&local_1e8);
      std::operator+(&local_1a0,&local_1c0,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      local_20a = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_208,"BgzfStream::ReadBlock",&local_209);
      BamException::BamException
                (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      local_20a = 0;
      __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
    }
    if (local_30 != local_180) {
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,"BgzfStream::ReadBlock",&local_231);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,"could not read data from block",&local_259);
      BamException::BamException
                (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
    }
    sVar5 = InflateBlock((BgzfStream *)
                         CONCAT17(in_stack_fffffffffffffee7,
                                  CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)),
                         in_stack_fffffffffffffed8);
    if (*in_RDI != 0) {
      in_RDI[1] = 0;
    }
    *(undefined8 *)(in_RDI + 2) = local_10;
    *in_RDI = (int)sVar5;
  }
  return;
}

Assistant:

void BgzfStream::ReadBlock()
{

    BT_ASSERT_X(m_device, "BgzfStream::ReadBlock() - trying to read from null IO device");

    // store block's starting address
    const int64_t blockAddress = m_device->Tell();

    // read block header from file
    char header[Constants::BGZF_BLOCK_HEADER_LENGTH];
    int64_t numBytesRead = m_device->Read(header, Constants::BGZF_BLOCK_HEADER_LENGTH);

    // check for device error
    if (numBytesRead < 0) {
        const std::string message = std::string("device error: ") + m_device->GetErrorString();
        throw BamException("BgzfStream::ReadBlock", message);
    }

    // if block header empty
    if (numBytesRead == 0) {
        m_blockLength = 0;
        return;
    }

    // if block header invalid size
    if (numBytesRead != static_cast<int8_t>(Constants::BGZF_BLOCK_HEADER_LENGTH))
        throw BamException("BgzfStream::ReadBlock", "invalid block header size");

    // validate block header contents
    if (!BgzfStream::CheckBlockHeader(header))
        throw BamException("BgzfStream::ReadBlock", "invalid block header contents");

    // copy header contents to compressed buffer
    const std::size_t blockLength = BamTools::UnpackUnsignedShort(&header[16]) + 1;
    memcpy(m_compressedBlock.Buffer, header, Constants::BGZF_BLOCK_HEADER_LENGTH);

    // read remainder of block
    const std::size_t remaining = blockLength - Constants::BGZF_BLOCK_HEADER_LENGTH;
    numBytesRead =
        m_device->Read(&m_compressedBlock.Buffer[Constants::BGZF_BLOCK_HEADER_LENGTH], remaining);

    // check for device error
    if (numBytesRead < 0) {
        const std::string message = std::string("device error: ") + m_device->GetErrorString();
        throw BamException("BgzfStream::ReadBlock", message);
    }

    // check that we read in expected numBytes
    if (numBytesRead != static_cast<int64_t>(remaining))
        throw BamException("BgzfStream::ReadBlock", "could not read data from block");

    // decompress block data
    const std::size_t newBlockLength = InflateBlock(blockLength);

    // update block data
    if (m_blockLength != 0) m_blockOffset = 0;
    m_blockAddress = blockAddress;
    m_blockLength = newBlockLength;
}